

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void __thiscall
llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::~BumpPtrAllocatorImpl
          (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this)

{
  iterator I;
  iterator E;
  BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this_local;
  
  I = SmallVectorTemplateCommon<void_*,_void>::begin
                ((SmallVectorTemplateCommon<void_*,_void> *)(this + 0x10));
  E = SmallVectorTemplateCommon<void_*,_void>::end
                ((SmallVectorTemplateCommon<void_*,_void> *)(this + 0x10));
  DeallocateSlabs(this,I,E);
  DeallocateCustomSizedSlabs(this);
  SmallVector<std::pair<void_*,_unsigned_long>,_0U>::~SmallVector
            ((SmallVector<std::pair<void_*,_unsigned_long>,_0U> *)(this + 0x40));
  SmallVector<void_*,_4U>::~SmallVector((SmallVector<void_*,_4U> *)(this + 0x10));
  return;
}

Assistant:

~BumpPtrAllocatorImpl() {
    DeallocateSlabs(Slabs.begin(), Slabs.end());
    DeallocateCustomSizedSlabs();
  }